

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

size_t cs_impl::hash<cs::type_id>(type_id *id)

{
  size_t sVar1;
  error *this;
  long in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 8) == 0) {
    sVar1 = std::type_index::hash_code((type_index *)0x15dbff);
    return sVar1;
  }
  this = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"E000F",&local_29);
  cov::error::error(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

std::size_t hash<cs::type_id>(const cs::type_id &id)
	{
		if (id.type_hash == 0)
			return id.type_idx.hash_code();
		else
			throw cov::error("E000F");
	}